

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTupleTo<std::tuple<pstore::gsl::not_null<void*>,unsigned_long>,2ul>
               (unsigned_long *t,ostream *param_2)

{
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<pstore::gsl::not_null<void*>,void,std::ostream&>((not_null<void_*> *)(t + 1),param_2);
  std::operator<<(param_2,", ");
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<unsigned_long,void,std::ostream&>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}